

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.h
# Opt level: O1

cbtScalar __thiscall
cbtCollisionWorld::AllHitsRayResultCallback::addSingleResult
          (AllHitsRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  cbtCollisionObject **ptr;
  cbtCollisionObject *pcVar9;
  cbtVector3 *pcVar10;
  float *pfVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  cbtCollisionObject **ppcVar16;
  long lVar17;
  cbtVector3 *pcVar18;
  float *pfVar19;
  long lVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  (this->super_RayResultCallback).m_collisionObject = rayResult->m_collisionObject;
  iVar7 = (this->m_collisionObjects).m_size;
  iVar8 = (this->m_collisionObjects).m_capacity;
  if (iVar7 == iVar8) {
    iVar21 = 1;
    if (iVar7 != 0) {
      iVar21 = iVar7 * 2;
    }
    if (iVar8 < iVar21) {
      if (iVar21 == 0) {
        ppcVar16 = (cbtCollisionObject **)0x0;
      }
      else {
        ppcVar16 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar21 << 3,0x10);
      }
      lVar17 = (long)(this->m_collisionObjects).m_size;
      if (0 < lVar17) {
        lVar20 = 0;
        do {
          ppcVar16[lVar20] = (this->m_collisionObjects).m_data[lVar20];
          lVar20 = lVar20 + 1;
        } while (lVar17 != lVar20);
      }
      ptr = (this->m_collisionObjects).m_data;
      if (ptr != (cbtCollisionObject **)0x0) {
        if ((this->m_collisionObjects).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_collisionObjects).m_data = (cbtCollisionObject **)0x0;
      }
      (this->m_collisionObjects).m_ownsMemory = true;
      (this->m_collisionObjects).m_data = ppcVar16;
      (this->m_collisionObjects).m_capacity = iVar21;
    }
  }
  iVar7 = (this->m_collisionObjects).m_size;
  (this->m_collisionObjects).m_data[iVar7] = rayResult->m_collisionObject;
  (this->m_collisionObjects).m_size = iVar7 + 1;
  if (normalInWorldSpace) {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(rayResult->m_hitNormalLocal).m_floats;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)((rayResult->m_hitNormalLocal).m_floats + 2);
  }
  else {
    pcVar9 = (this->super_RayResultCallback).m_collisionObject;
    cVar4 = (rayResult->m_hitNormalLocal).m_floats[0];
    fVar6 = (rayResult->m_hitNormalLocal).m_floats[1];
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar9->m_worldTransform).m_basis.m_el[0].
                                                     m_floats[1])),ZEXT416((uint)cVar4),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[0]))
    ;
    cVar5 = (rayResult->m_hitNormalLocal).m_floats[2];
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)cVar5),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[0].m_floats[2]))
    ;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar9->m_worldTransform).m_basis.m_el[1].
                                                     m_floats[1])),ZEXT416((uint)cVar4),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[1].m_floats[0]))
    ;
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar5),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[1].m_floats[2]))
    ;
    auVar23 = vinsertps_avx(auVar23,auVar13,0x10);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (pcVar9->m_worldTransform).m_basis.m_el[2].
                                                     m_floats[1])),ZEXT416((uint)cVar4),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[0]))
    ;
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)cVar5),
                              ZEXT416((uint)(pcVar9->m_worldTransform).m_basis.m_el[2].m_floats[2]))
    ;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
    auVar22._4_12_ = SUB1612(auVar14 << 0x40,4);
    auVar22._0_4_ = auVar13._0_4_;
  }
  iVar7 = (this->m_hitNormalWorld).m_size;
  iVar8 = (this->m_hitNormalWorld).m_capacity;
  if (iVar7 == iVar8) {
    iVar21 = 1;
    if (iVar7 != 0) {
      iVar21 = iVar7 * 2;
    }
    if (iVar8 < iVar21) {
      if (iVar21 == 0) {
        pcVar18 = (cbtVector3 *)0x0;
      }
      else {
        pcVar18 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar21 << 4,0x10);
      }
      lVar17 = (long)(this->m_hitNormalWorld).m_size;
      if (0 < lVar17) {
        lVar20 = 0;
        do {
          puVar2 = (undefined8 *)((long)((this->m_hitNormalWorld).m_data)->m_floats + lVar20);
          uVar15 = puVar2[1];
          puVar3 = (undefined8 *)((long)pcVar18->m_floats + lVar20);
          *puVar3 = *puVar2;
          puVar3[1] = uVar15;
          lVar20 = lVar20 + 0x10;
        } while (lVar17 * 0x10 != lVar20);
      }
      pcVar10 = (this->m_hitNormalWorld).m_data;
      if (pcVar10 != (cbtVector3 *)0x0) {
        if ((this->m_hitNormalWorld).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pcVar10);
        }
        (this->m_hitNormalWorld).m_data = (cbtVector3 *)0x0;
      }
      (this->m_hitNormalWorld).m_ownsMemory = true;
      (this->m_hitNormalWorld).m_data = pcVar18;
      (this->m_hitNormalWorld).m_capacity = iVar21;
    }
  }
  auVar23 = vmovlhps_avx(auVar23,auVar22);
  *(undefined1 (*) [16])(this->m_hitNormalWorld).m_data[(this->m_hitNormalWorld).m_size].m_floats =
       auVar23;
  piVar1 = &(this->m_hitNormalWorld).m_size;
  *piVar1 = *piVar1 + 1;
  fVar6 = rayResult->m_hitFraction;
  fVar12 = 1.0 - fVar6;
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->m_rayToWorld).m_floats[0])),
                            ZEXT416((uint)fVar12),ZEXT416((uint)(this->m_rayFromWorld).m_floats[0]))
  ;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->m_rayToWorld).m_floats[1])),
                            ZEXT416((uint)fVar12),ZEXT416((uint)(this->m_rayFromWorld).m_floats[1]))
  ;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->m_rayToWorld).m_floats[2])),
                            ZEXT416((uint)fVar12),ZEXT416((uint)(this->m_rayFromWorld).m_floats[2]))
  ;
  iVar7 = (this->m_hitPointWorld).m_size;
  iVar8 = (this->m_hitPointWorld).m_capacity;
  if (iVar7 == iVar8) {
    iVar21 = 1;
    if (iVar7 != 0) {
      iVar21 = iVar7 * 2;
    }
    if (iVar8 < iVar21) {
      if (iVar21 == 0) {
        pcVar18 = (cbtVector3 *)0x0;
      }
      else {
        pcVar18 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar21 << 4,0x10);
      }
      lVar17 = (long)(this->m_hitPointWorld).m_size;
      if (0 < lVar17) {
        lVar20 = 0;
        do {
          puVar2 = (undefined8 *)((long)((this->m_hitPointWorld).m_data)->m_floats + lVar20);
          uVar15 = puVar2[1];
          puVar3 = (undefined8 *)((long)pcVar18->m_floats + lVar20);
          *puVar3 = *puVar2;
          puVar3[1] = uVar15;
          lVar20 = lVar20 + 0x10;
        } while (lVar17 * 0x10 != lVar20);
      }
      pcVar10 = (this->m_hitPointWorld).m_data;
      if (pcVar10 != (cbtVector3 *)0x0) {
        if ((this->m_hitPointWorld).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pcVar10);
        }
        (this->m_hitPointWorld).m_data = (cbtVector3 *)0x0;
      }
      (this->m_hitPointWorld).m_ownsMemory = true;
      (this->m_hitPointWorld).m_data = pcVar18;
      (this->m_hitPointWorld).m_capacity = iVar21;
    }
  }
  pcVar18 = (this->m_hitPointWorld).m_data;
  iVar7 = (this->m_hitPointWorld).m_size;
  pcVar18[iVar7].m_floats[0] = auVar23._0_4_;
  pcVar18[iVar7].m_floats[1] = auVar13._0_4_;
  pcVar18[iVar7].m_floats[2] = auVar14._0_4_;
  piVar1 = &(this->m_hitPointWorld).m_size;
  *piVar1 = *piVar1 + 1;
  iVar7 = (this->m_hitFractions).m_size;
  iVar8 = (this->m_hitFractions).m_capacity;
  if (iVar7 == iVar8) {
    iVar21 = 1;
    if (iVar7 != 0) {
      iVar21 = iVar7 * 2;
    }
    if (iVar8 < iVar21) {
      if (iVar21 == 0) {
        pfVar19 = (float *)0x0;
      }
      else {
        pfVar19 = (float *)cbtAlignedAllocInternal((long)iVar21 << 2,0x10);
      }
      lVar17 = (long)(this->m_hitFractions).m_size;
      if (0 < lVar17) {
        pfVar11 = (this->m_hitFractions).m_data;
        lVar20 = 0;
        do {
          pfVar19[lVar20] = pfVar11[lVar20];
          lVar20 = lVar20 + 1;
        } while (lVar17 != lVar20);
      }
      pfVar11 = (this->m_hitFractions).m_data;
      if (pfVar11 != (float *)0x0) {
        if ((this->m_hitFractions).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pfVar11);
        }
        (this->m_hitFractions).m_data = (float *)0x0;
      }
      (this->m_hitFractions).m_ownsMemory = true;
      (this->m_hitFractions).m_data = pfVar19;
      (this->m_hitFractions).m_capacity = iVar21;
    }
  }
  iVar7 = (this->m_hitFractions).m_size;
  (this->m_hitFractions).m_data[iVar7] = rayResult->m_hitFraction;
  (this->m_hitFractions).m_size = iVar7 + 1;
  return (this->super_RayResultCallback).m_closestHitFraction;
}

Assistant:

virtual cbtScalar addSingleResult(LocalRayResult& rayResult, bool normalInWorldSpace)
		{
			m_collisionObject = rayResult.m_collisionObject;
			m_collisionObjects.push_back(rayResult.m_collisionObject);
			cbtVector3 hitNormalWorld;
			if (normalInWorldSpace)
			{
				hitNormalWorld = rayResult.m_hitNormalLocal;
			}
			else
			{
				///need to transform normal into worldspace
				hitNormalWorld = m_collisionObject->getWorldTransform().getBasis() * rayResult.m_hitNormalLocal;
			}
			m_hitNormalWorld.push_back(hitNormalWorld);
			cbtVector3 hitPointWorld;
			hitPointWorld.setInterpolate3(m_rayFromWorld, m_rayToWorld, rayResult.m_hitFraction);
			m_hitPointWorld.push_back(hitPointWorld);
			m_hitFractions.push_back(rayResult.m_hitFraction);
			return m_closestHitFraction;
		}